

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask11_32(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0xb | *out;
  *out = in[2] << 0x16 | *out;
  puVar1 = out + 1;
  *puVar1 = in[2] >> 10;
  *puVar1 = in[3] << 1 | *puVar1;
  *puVar1 = in[4] << 0xc | *puVar1;
  *puVar1 = in[5] << 0x17 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[5] >> 9;
  *puVar1 = in[6] << 2 | *puVar1;
  *puVar1 = in[7] << 0xd | *puVar1;
  *puVar1 = in[8] << 0x18 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[8] >> 8;
  *puVar1 = in[9] << 3 | *puVar1;
  *puVar1 = in[10] << 0xe | *puVar1;
  *puVar1 = in[0xb] << 0x19 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[0xb] >> 7;
  *puVar1 = in[0xc] << 4 | *puVar1;
  *puVar1 = in[0xd] << 0xf | *puVar1;
  *puVar1 = in[0xe] << 0x1a | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[0xe] >> 6;
  *puVar1 = in[0xf] << 5 | *puVar1;
  *puVar1 = in[0x10] << 0x10 | *puVar1;
  *puVar1 = in[0x11] << 0x1b | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[0x11] >> 5;
  *puVar1 = in[0x12] << 6 | *puVar1;
  *puVar1 = in[0x13] << 0x11 | *puVar1;
  *puVar1 = in[0x14] << 0x1c | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[0x14] >> 4;
  *puVar1 = in[0x15] << 7 | *puVar1;
  *puVar1 = in[0x16] << 0x12 | *puVar1;
  *puVar1 = in[0x17] << 0x1d | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[0x17] >> 3;
  *puVar1 = in[0x18] << 8 | *puVar1;
  *puVar1 = in[0x19] << 0x13 | *puVar1;
  *puVar1 = in[0x1a] << 0x1e | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[0x1a] >> 2;
  *puVar1 = in[0x1b] << 9 | *puVar1;
  *puVar1 = in[0x1c] << 0x14 | *puVar1;
  *puVar1 = in[0x1d] << 0x1f | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[0x1d] >> 1;
  *puVar1 = in[0x1e] << 10 | *puVar1;
  *puVar1 = in[0x1f] << 0x15 | *puVar1;
  return out + 0xb;
}

Assistant:

uint32_t *__fastpackwithoutmask11_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (11 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (11 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (11 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (11 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (11 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (11 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (11 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (11 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 19;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (11 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (11 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  ++in;

  return out;
}